

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O3

void TasGrid::OneDimensionalNodes::getGaussJacobi
               (int m,vector<double,_std::allocator<double>_> *w,
               vector<double,_std::allocator<double>_> *x,double alpha,double beta)

{
  ulong uVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  vector<double,_std::allocator<double>_> off_diag;
  vector<double,_std::allocator<double>_> diag;
  allocator_type local_e9;
  double local_e8;
  double local_e0;
  undefined1 local_d8 [16];
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  vector<double,_std::allocator<double>_> *local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_98._8_4_ = in_XMM0_Dc;
  local_98._0_8_ = alpha;
  local_98._12_4_ = in_XMM0_Dd;
  local_88._8_4_ = in_XMM0_Dc;
  local_88._0_8_ = alpha + beta;
  local_88._12_4_ = in_XMM0_Dd;
  local_d8 = ZEXT816(0x3ff0000000000000);
  local_e8 = beta;
  local_e0 = exp2(alpha + beta + 1.0);
  uVar5 = local_d8._12_4_;
  local_d8._8_4_ = local_d8._8_4_;
  local_d8._0_8_ = local_d8._0_8_ + local_e8;
  local_d8._12_4_ = uVar5;
  local_58._8_4_ = SUB84((double)local_88._0_8_ + 2.0,0);
  local_58._0_8_ = (double)local_98._0_8_ + 1.0;
  local_58._12_4_ = (int)((ulong)((double)local_88._0_8_ + 2.0) >> 0x20);
  local_60 = tgamma((double)local_98._0_8_ + 1.0);
  local_68 = tgamma((double)local_d8._0_8_);
  local_48._8_4_ = local_58._8_4_;
  local_48._0_8_ = local_58._8_8_;
  local_48._12_4_ = local_58._12_4_;
  local_70 = tgamma(local_58._8_8_);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_b0,(long)m,(allocator_type *)&local_c8);
  uVar3 = m - 1;
  ::std::vector<double,_std::allocator<double>_>::vector(&local_c8,(long)(int)uVar3,&local_e9);
  dVar6 = (local_e0 * local_60 * local_68) / local_70;
  *local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = (local_e8 - (double)local_98._0_8_) / (double)local_48._0_8_;
  if (1 < m) {
    dVar9 = ((double)local_d8._0_8_ * (double)local_58._0_8_ * 4.0) /
            ((double)local_58._8_8_ * ((double)local_88._0_8_ + 3.0) * (double)local_58._8_8_);
    local_e0 = dVar6;
    local_78 = w;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
      dVar6 = (double)local_98._0_8_;
    }
    else {
      dVar9 = SQRT(dVar9);
      dVar6 = (double)local_98._0_8_;
    }
    *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = dVar9;
    dVar9 = local_e8 * local_e8 - dVar6 * dVar6;
    if (m != 2) {
      local_d8._0_8_ = dVar9;
      uVar4 = 1;
      dVar8 = local_e8;
      do {
        uVar1 = uVar4 + 1;
        dVar2 = (double)(int)uVar1;
        dVar7 = dVar2 + dVar2 + (double)local_88._0_8_;
        local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar4] = dVar9 / ((dVar7 + -2.0) * dVar7);
        dVar2 = ((dVar2 + dVar8) * (dVar2 + dVar6) * dVar2 * 4.0 * ((double)local_88._0_8_ + dVar2))
                / ((dVar7 * dVar7 + -1.0) * dVar7 * dVar7);
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
          dVar8 = local_e8;
          dVar6 = (double)local_98._0_8_;
          dVar9 = (double)local_d8._0_8_;
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar4] = dVar2;
        uVar4 = uVar1;
      } while (uVar3 != uVar1);
    }
    dVar6 = (double)m + (double)m + (double)local_88._0_8_;
    local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(int)uVar3] = dVar9 / ((dVar6 + -2.0) * dVar6);
    w = local_78;
    dVar6 = local_e0;
  }
  TasmanianTridiagonalSolver::decompose(&local_b0,&local_c8,dVar6,x,w);
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void OneDimensionalNodes::getGaussJacobi(int m, std::vector<double> &w, std::vector<double> &x, double alpha, double beta){
    double ab = alpha + beta;
    double mu0 = pow(2.0, 1.0 + ab) * tgamma(alpha + 1.0) * tgamma(beta + 1.0) / tgamma(2.0 + ab);
    std::vector<double> diag(m), off_diag(m-1);
    diag[0] = (beta - alpha) / (2.0 + ab);
    if (m > 1) {
        off_diag[0] =  std::sqrt(4.0 * (1.0 + alpha) * (1.0 + beta) / ((3.0 + ab) * (2.0 + ab) * (2.0 + ab)));
        for(int i=1; i<m-1; i++){
            double di = (double) (i+1);
            diag[i] =  (beta * beta - alpha * alpha) / ((2.0 * di + ab -2.0) * (2.0 * di + ab));
            off_diag[i] = std::sqrt(4.0 * di * (di + alpha) * (di + beta) * (di + ab) /
                                    (((2.0 * di + ab) * (2.0 * di + ab) - 1.0) * (2.0 * di + ab) * (2.0 * di + ab)));
        }
        double dm = (double) m;
        diag[m-1] = (beta * beta - alpha * alpha) / ((2.0 * dm + ab - 2.0) * (2.0 * dm + ab));;
    }
    TasmanianTridiagonalSolver::decompose(diag, off_diag, mu0, x, w);
}